

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  size_t inlen;
  
  if (len != 0) {
    do {
      inlen = 0x4000;
      if (len < 0x4000) {
        inlen = len;
      }
      iVar4 = ptls_buffer_reserve(buf,3);
      if (iVar4 != 0) {
        return iVar4;
      }
      puVar2 = buf->base;
      sVar3 = buf->off;
      puVar1 = puVar2 + sVar3;
      puVar1[0] = '\x17';
      puVar1[1] = '\x03';
      puVar2[sVar3 + 2] = '\x03';
      buf->off = buf->off + 3;
      iVar4 = ptls_buffer_reserve(buf,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      puVar1 = buf->base;
      sVar3 = buf->off;
      (puVar1 + sVar3)[0] = '\0';
      (puVar1 + sVar3)[1] = '\0';
      sVar3 = buf->off;
      buf->off = sVar3 + 2;
      iVar4 = ptls_buffer_reserve(buf,inlen + enc->aead->algo->tag_size + 1);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = aead_encrypt(enc,buf->base + buf->off,src,inlen,type);
      sVar5 = sVar5 + buf->off;
      buf->off = sVar5;
      lVar6 = sVar5 - (sVar3 + 2);
      buf->base[sVar3] = (uint8_t)((ulong)lVar6 >> 8);
      buf->base[sVar3 + 1] = (uint8_t)lVar6;
      src = src + inlen;
      len = len - inlen;
    } while (len != 0);
  }
  return 0;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(buf, chunk_size + enc->aead->algo->tag_size + 1)) != 0)
                goto Exit;
            buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
        });
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}